

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_MoveAssign_Test::~Table_MoveAssign_Test
          (Table_MoveAssign_Test *this)

{
  Table_MoveAssign_Test *this_local;
  
  ~Table_MoveAssign_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, MoveAssign) {
  StringTable t;
  t.emplace("a", "b");
  EXPECT_EQ(1, t.size());
  StringTable u;
  u = std::move(t);
  EXPECT_EQ(1, u.size());
  EXPECT_THAT(*u.find("a"), Pair("a", "b"));
}